

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O3

UINT8 k051649_r(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  k051649_state *info;
  
  switch(offset >> 1) {
  case '\0':
  case '\x04':
    break;
  case '\x01':
  case '\x02':
  case '\x03':
    return 0xff;
  case '\x05':
    *(undefined1 *)((long)chip + 0xec) = 0xff;
    return 0xff;
  default:
    return '\0';
  }
  bVar1 = *(byte *)((long)chip + 0xed);
  bVar2 = *(byte *)((long)chip + 0xec);
  if (*(char *)((long)chip + 0xee) == '\0') {
    uVar4 = 0;
    if ((bVar2 & 0xc0) != 0) {
      if ((bVar2 & 0xc0) == 0xc0 || bVar1 < 0x60) {
        uVar4 = 0;
        if ((bVar2 & 0x40) == 0) goto LAB_00162d3a;
        lVar3 = (ulong)(bVar1 >> 5) * 0x2c + 8;
      }
      else {
        lVar3 = (ulong)(bVar2 >> 6 & 1) * 0x2c + 0x8c;
      }
      uVar4 = (uint)*(ushort *)((long)chip + lVar3 + 2);
    }
  }
  else {
    uVar4 = 0;
    if ((bVar2 & 0x40) != 0) {
      uVar4 = (uint)*(ushort *)((long)chip + (ulong)(bVar1 >> 5) * 0x2c + 10);
    }
  }
LAB_00162d3a:
  return *(UINT8 *)((long)chip + (ulong)(uVar4 + bVar1 & 0x1f) + 0x12 + (ulong)(bVar1 >> 5) * 0x2c);
}

Assistant:

static UINT8 k051649_r(void *chip, UINT8 offset, UINT8 data)
{
	k051649_state *info = (k051649_state *)chip;
	
	switch(offset >> 1)
	{
	case 0x00:
	case 0x04:
		if (! info->mode_plus)
			return k051649_waveform_r(chip, info->cur_reg);
		else
			return k052539_waveform_r(chip, info->cur_reg);
	case 0x01:
		return 0xFF;
	case 0x02:
		return 0xFF;
	case 0x03:
		return 0xFF;
	case 0x05:
		return k051649_test_r(chip, info->cur_reg);
	default:
		return 0x00;
	}
}